

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v6::internal::
    parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
              (char **begin,char *end,
              specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
              *eh)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  error_handler local_1;
  
  cVar3 = **begin;
  pcVar2 = *begin + 1;
  if (cVar3 == '0') {
    *begin = pcVar2;
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      if (0xccccccc < uVar1) goto LAB_00121757;
      uVar1 = ((int)cVar3 + uVar1 * 10) - 0x30;
      *begin = pcVar2;
      if (pcVar2 == end) break;
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while ((byte)(cVar3 - 0x30U) < 10);
    if ((int)uVar1 < 0) {
LAB_00121757:
      error_handler::on_error(&local_1,"number is too big");
    }
  }
  return uVar1;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}